

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O0

void __thiscall
QCommandLineOptionPrivate::QCommandLineOptionPrivate
          (QCommandLineOptionPrivate *this,QStringList *names)

{
  long lVar1;
  QStringList *nameList;
  long in_RDI;
  long in_FS_OFFSET;
  QList<QString> *in_stack_ffffffffffffff98;
  QList<QString> *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QSharedData::QSharedData((QSharedData *)0x6ee7af);
  nameList = (QStringList *)(in_RDI + 8);
  QList<QString>::QList(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  removeInvalidNames(nameList);
  QList<QString>::~QList((QList<QString> *)0x6ee7ec);
  QString::QString((QString *)0x6ee7fa);
  QString::QString((QString *)0x6ee808);
  QList<QString>::QList((QList<QString> *)0x6ee816);
  QFlags<QCommandLineOption::Flag>::QFlags((QFlags<QCommandLineOption::Flag> *)0x6ee824);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
    explicit QCommandLineOptionPrivate(const QStringList &names)
        : names(removeInvalidNames(names))
    { }